

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

obj * floorfood(char *verb)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  boolean bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  code *pcVar11;
  char *pcVar12;
  trap *trap;
  obj *poVar13;
  char *pcVar14;
  you *unaff_R12;
  _func_boolean_obj_ptr *allow;
  bool bVar15;
  object_pick *floorfood_list;
  char qbuf_1 [128];
  char qbuf [128];
  object_pick *local_140;
  char local_138 [128];
  char local_b8 [136];
  
  iVar8 = strcmp(verb,"eat");
  iVar9 = strcmp(verb,"sacrifice");
  iVar10 = strcmp(verb,"tin");
  if ((verb == (char *)0x0) || (*verb == '\0')) {
    impossible("floorfood: no verb given");
  }
  if (iVar8 == 0) {
    pcVar11 = is_edible;
  }
  else {
    pcVar11 = other_floorfood;
  }
  if (iVar10 == 0) {
    pcVar11 = tinnable;
  }
  allow = can_sacrifice;
  if (iVar9 != 0) {
    allow = pcVar11;
  }
  bVar6 = can_reach_floor();
  if ((bVar6 != '\0') && ((unaff_R12 = &u, iVar8 != 0 || (u.usteed == (monst *)0x0)))) {
    bVar6 = is_pool(level,(int)u.ux,(int)u.uy);
    if ((bVar6 == '\0') && (bVar6 = is_lava(level,(int)u.ux,(int)u.uy), bVar6 == '\0'))
    goto LAB_0018f718;
    if (((u.uprops[0x27].extrinsic == 0) ||
        (bVar6 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar6 != '\0')) &&
       (uVar1 = (youmonst.data)->mflags1, (uVar1 & 0x10) == 0)) {
      if (((uVar1 & 1) == 0) && (u.uprops[0x3c].extrinsic == 0)) {
        bVar2 = true;
        if ((u.usteed == (monst *)0x0) || (bVar3 = false, ((u.usteed)->data->mflags1 & 1) == 0)) {
LAB_0018f718:
          bVar3 = false;
          bVar2 = true;
          bVar4 = false;
          goto LAB_0018f733;
        }
        bVar4 = false;
        if (u.uprops[0x31].intrinsic != 0) goto LAB_0018f733;
      }
      else if (u.uprops[0x31].intrinsic != 0) goto LAB_0018f718;
      bVar2 = true;
      bVar4 = false;
      if ((uVar1 & 0x400) != 0 || u.uprops[0x31].extrinsic != 0) {
        bVar3 = false;
        goto LAB_0018f733;
      }
    }
  }
  bVar4 = false;
  bVar2 = true;
LAB_0018f827:
  do {
    if (!bVar2) {
LAB_0018f893:
      if (unaff_R12 == (you *)0x0) {
        unaff_R12 = (you *)0x0;
      }
      else {
        bVar6 = (*allow)((obj *)unaff_R12);
        if (bVar6 == '\0') {
          unaff_R12 = (you *)0x0;
          pline("You can\'t %s that!",verb);
        }
      }
      return (obj *)unaff_R12;
    }
    if (iVar9 == 0) {
      pcVar12 = "\x05\a";
      pcVar14 = "\x15\x16\x05\a";
    }
    else if (iVar8 == 0) {
      pcVar12 = "\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n";
      pcVar14 = "\x15\x16\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n";
    }
    else {
      pcVar12 = "\a";
      pcVar14 = "\x15\x16\a";
    }
    if (!bVar4) {
      pcVar14 = pcVar12;
    }
    bVar2 = false;
    unaff_R12 = (you *)getobj(pcVar14,verb,(obj **)0x0);
    bVar3 = true;
    if (unaff_R12 != (you *)&zeroobj) goto LAB_0018f893;
LAB_0018f733:
    bVar5 = bVar4;
    if (((iVar8 == 0) && ((int)(youmonst.data)->mflags1 < 0)) &&
       (trap = t_at(level,(int)u.ux,(int)u.uy), trap != (trap *)0x0)) {
      bVar15 = (trap->field_0x8 & 0x3f) == 0x25;
      bVar5 = true;
      if (!bVar15) {
        bVar5 = bVar4;
      }
      if ((bool)(bVar15 & bVar3)) {
        pcVar14 = "holding you";
        if (u.utraptype != 0) {
          pcVar14 = "armed";
        }
        if (u.utrap == 0) {
          pcVar14 = "armed";
        }
        sprintf(local_b8,"There is a bear trap here (%s); eat it?",pcVar14);
        cVar7 = yn_function(local_b8,"ynq",'n');
        if (cVar7 == 'q') {
          return (obj *)0x0;
        }
        bVar5 = bVar4;
        if (cVar7 == 'y') {
          u.utrap = 0;
          u.utraptype = 0;
          deltrap(level,trap);
          poVar13 = mksobj(level,0xf9,'\x01','\0');
          return poVar13;
        }
      }
    }
    bVar4 = bVar5;
    if (bVar3) {
      cVar7 = highc(*verb);
      unaff_R12 = (you *)0x0;
      sprintf(local_138,"%c%s what?",(ulong)(uint)(int)cVar7,verb + 1);
      iVar10 = query_objlist(local_138,level->objects[u.ux][u.uy],9,&local_140,1,allow);
      if (iVar10 != 0) {
        unaff_R12 = (you *)local_140->obj;
        free(local_140);
      }
    }
    else {
      for (unaff_R12 = (you *)level->objects[u.ux][u.uy]; unaff_R12 != (you *)0x0;
          unaff_R12 = *(you **)&unaff_R12->uz) {
        bVar6 = (*allow)((obj *)unaff_R12);
        if (bVar6 != '\0') {
          bVar4 = true;
          goto LAB_0018f827;
        }
      }
      unaff_R12 = (you *)0x0;
    }
  } while( true );
}

Assistant:

struct obj *floorfood(const char *verb)
{
	struct obj *otmp;
	char qbuf[QBUFSZ];
	char c;
	boolean feeding = (!strcmp(verb, "eat"));
	boolean sacrificing = (!strcmp(verb, "sacrifice"));
	boolean tinning = (!strcmp(verb, "tin"));
	boolean can_floorfood = FALSE;
	boolean checking_can_floorfood = TRUE;
	boolean (*floorfood_check)(const struct obj *);

	if (!verb || !*verb)
	    impossible("floorfood: no verb given");

	floorfood_check = (sacrificing ? can_sacrifice :
			   tinning ? tinnable :
			   feeding ? is_edible : other_floorfood);

	/* if we can't touch floor objects then use invent food only */
	if (!can_reach_floor() ||
		(feeding && u.usteed) || /* can't eat off floor while riding */
		((is_pool(level, u.ux, u.uy) || is_lava(level, u.ux, u.uy)) &&
		    (Wwalking || is_clinger(youmonst.data) ||
			(Flying && !Breathless))))
	    goto skipfloor;

    eat_floorfood:
	/* Two passes:
	 *
	 * 1) Check if anything on the floor can be chosen and make it available
	 *    from the object picking prompt.
	 * 2) If the floor was chosen (,) from that prompt, go through again,
	 *    this time asking for the specific floor option.
	 */

	if (feeding && metallivorous(youmonst.data)) {
	    struct trap *ttmp = t_at(level, u.ux, u.uy);

	    if (ttmp && ttmp->tseen && ttmp->ttyp == BEAR_TRAP) {
		if (checking_can_floorfood) {
		    can_floorfood = TRUE;
		} else {
		    /* If not already stuck in the trap, perhaps there should
		       be a chance to becoming trapped?  Probably not, because
		       then the trap would just get eaten on the _next_ turn... */
		    sprintf(qbuf, "There is a bear trap here (%s); eat it?",
			    (u.utrap && u.utraptype == TT_BEARTRAP) ?
			    "holding you" : "armed");
		    if ((c = yn_function(qbuf, ynqchars, 'n')) == 'y') {
			u.utrap = u.utraptype = 0;
			deltrap(level, ttmp);
			return mksobj(level, BEARTRAP, TRUE, FALSE);
		    } else if (c == 'q') {
			return NULL;
		    }
		}
	    }
	}

	if (checking_can_floorfood) {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if ((*floorfood_check)(otmp)) {
		    can_floorfood = TRUE;
		    break;
		}
	    }
	} else {
	    struct object_pick *floorfood_list;
	    char qbuf[QBUFSZ];
	    int n;
	    sprintf(qbuf, "%c%s what?", highc(*verb), verb + 1);
	    n = query_objlist(qbuf, level->objects[u.ux][u.uy],
			      BY_NEXTHERE|INVORDER_SORT, &floorfood_list,
			      PICK_ONE, floorfood_check);
	    if (n) {
		otmp = floorfood_list[0].obj;
		free(floorfood_list);
	    } else {
		otmp = NULL;
	    }
	}

    skipfloor:
	if (checking_can_floorfood) {
	    /* We cannot use ALL_CLASSES since that causes getobj() to skip its
	     * "ugly checks" and we need to check for inedible items.
	     */
	    otmp = getobj(
		    sacrificing ?
			(can_floorfood ? sacrifice_types_ground : sacrifice_types) :
		    feeding ?
			(can_floorfood ? allobj_ground : allobj) :
			(can_floorfood ? comestibles_ground : comestibles),
		    verb, NULL);
	    if (otmp == &zeroobj) {
		checking_can_floorfood = FALSE;
		goto eat_floorfood;
	    }
	}

	if (otmp && !(*floorfood_check)(otmp)) {
	    pline("You can't %s that!", verb);
	    return NULL;
	}
	return otmp;
}